

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_function.hpp
# Opt level: O0

AggregateFunction *
duckdb::UDFWrapper::
CreateBinaryAggregateFunction<duckdb::UDFCovarPopOperation,duckdb::udf_covar_state_t,double,double,int>
          (string *name,LogicalType *ret_type,LogicalType *input_type_a,LogicalType *input_type_b)

{
  LogicalType *in_RDX;
  string *in_RSI;
  AggregateFunction *in_RDI;
  AggregateFunction *aggr_function;
  LogicalType *in_stack_00000098;
  LogicalType *in_stack_000000a0;
  LogicalType *in_stack_000000a8;
  AggregateFunction *pAVar1;
  LogicalType local_48 [31];
  undefined1 local_29;
  string *local_10;
  
  local_29 = 0;
  pAVar1 = in_RDI;
  local_10 = in_RSI;
  duckdb::LogicalType::LogicalType(local_48,in_RDX);
  AggregateFunction::
  BinaryAggregate<duckdb::udf_covar_state_t,double,int,double,duckdb::UDFCovarPopOperation,(duckdb::AggregateDestructorType)0>
            (in_stack_000000a8,in_stack_000000a0,in_stack_00000098);
  duckdb::LogicalType::~LogicalType(local_48);
  std::__cxx11::string::operator=((string *)&in_RDI->field_0x8,local_10);
  return pAVar1;
}

Assistant:

inline static AggregateFunction CreateBinaryAggregateFunction(const string &name, const LogicalType &ret_type,
	                                                              const LogicalType &input_type_a,
	                                                              const LogicalType &input_type_b) {
		AggregateFunction aggr_function =
		    AggregateFunction::BinaryAggregate<STATE, TA, TB, TR, UDF_OP>(input_type_a, input_type_b, ret_type);
		aggr_function.name = name;
		return aggr_function;
	}